

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O1

int dlep_writer_map_identity
              (dlep_writer *writer,oonf_layer2_data *data,oonf_layer2_metadata *meta,uint16_t tlv,
              uint16_t length,uint64_t scaling)

{
  oonf_layer2_data_type oVar1;
  oonf_layer2_metadata *poVar2;
  uint uVar3;
  ulong uVar4;
  ulong *data_00;
  int iVar5;
  uint8_t tmp8;
  uint16_t tmp16;
  uint32_t tmp32;
  uint64_t tmp64;
  undefined1 local_1f;
  ushort local_1e;
  uint local_1c;
  ulong local_18;
  
  iVar5 = 0;
  if ((data->_origin != (oonf_layer2_origin *)0x0) && (data->_meta != (oonf_layer2_metadata *)0x0))
  {
    poVar2 = data->_meta;
    oVar1 = poVar2->type;
    iVar5 = -1;
    if (meta->type == oVar1) {
      if (oVar1 == OONF_LAYER2_BOOLEAN_DATA) {
        if (poVar2 == (oonf_layer2_metadata *)0x0) {
          uVar4 = 0;
        }
        else {
          uVar4 = (ulong)(data->_value).addr._addr[0];
        }
      }
      else {
        if (oVar1 != OONF_LAYER2_INTEGER_DATA) {
          return -1;
        }
        uVar4 = 0;
        if ((data->_origin != (oonf_layer2_origin *)0x0) && (poVar2 != (oonf_layer2_metadata *)0x0))
        {
          if (scaling == 0) {
            scaling = poVar2->scaling;
          }
          uVar4 = poVar2->scaling;
          if (uVar4 < scaling) {
            uVar4 = (scaling / uVar4) * (data->_value).integer;
          }
          else {
            uVar4 = (ulong)(data->_value).integer / (uVar4 / scaling);
          }
        }
      }
      switch(length) {
      case 1:
        data_00 = (ulong *)&local_1f;
        local_1f = (undefined1)uVar4;
        break;
      case 2:
        local_1e = (ushort)uVar4 << 8 | (ushort)uVar4 >> 8;
        data_00 = (ulong *)&local_1e;
        break;
      default:
        goto switchD_0010a384_caseD_3;
      case 4:
        uVar3 = (uint)uVar4;
        local_1c = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        data_00 = (ulong *)&local_1c;
        break;
      case 8:
        local_18 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                   (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                   (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28
                   | uVar4 << 0x38;
        data_00 = &local_18;
      }
      dlep_writer_add_tlv(writer,tlv,data_00,length);
      iVar5 = 0;
    }
  }
switchD_0010a384_caseD_3:
  return iVar5;
}

Assistant:

int
dlep_writer_map_identity(struct dlep_writer *writer, struct oonf_layer2_data *data,
  const struct oonf_layer2_metadata *meta, uint16_t tlv, uint16_t length, uint64_t scaling) {
  int64_t l2value64;
  uint64_t tmp64;
  uint32_t tmp32;
  uint16_t tmp16;
  uint8_t tmp8;
  void *value;

  if (!oonf_layer2_data_has_value(data)) {
    /* no data available */
    return 0;
  }
  if (meta->type != oonf_layer2_data_get_type(data)) {
    /* bad data type */
    return -1;
  }

  switch (oonf_layer2_data_get_type(data)) {
    case OONF_LAYER2_INTEGER_DATA:
      l2value64 = oonf_layer2_data_get_int64(data, scaling, 0);
      break;
    case OONF_LAYER2_BOOLEAN_DATA:
      l2value64 = oonf_layer2_data_get_boolean(data, false) ? 1 : 0;
      break;
    default:
      return -1;
  }

  switch (length) {
    case 8:
      tmp64 = htobe64((uint64_t)l2value64);
      value = &tmp64;
      break;
    case 4:
      tmp32 = htonl((uint32_t)((int32_t)l2value64));
      value = &tmp32;
      break;
    case 2:
      tmp16 = htons((uint16_t)((int16_t)l2value64));
      value = &tmp16;
      break;
    case 1:
      tmp8 = (uint8_t)((int8_t)l2value64);
      value = &tmp8;
      break;
    default:
      return -1;
  }

  dlep_writer_add_tlv(writer, tlv, value, length);
  return 0;
}